

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O3

void __thiscall PRED<UF>::FirstScan(PRED<UF> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  Mat1i *pMVar7;
  Mat1b *pMVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  uint *puVar19;
  long lVar20;
  int iVar21;
  uint *puVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  char *pcVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  long local_88;
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar35 = 0;
  memset(*(void **)&pMVar7->field_0x10,0,*(long *)&pMVar7->field_0x20 - *(long *)&pMVar7->field_0x18
        );
  puVar15 = UF::P_;
  *UF::P_ = 0;
  UF::length_ = 1;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar37 = *(int *)&pMVar8->field_0xc;
  lVar25 = (long)iVar37;
  uVar6 = *(uint *)&pMVar8->field_0x8;
  lVar9 = *(long *)&pMVar8->field_0x10;
  plVar10 = *(long **)&pMVar8->field_0x48;
  lVar11 = *(long *)&pMVar7->field_0x10;
  plVar12 = *(long **)&pMVar7->field_0x48;
  if (0 < lVar25) {
    do {
      iVar21 = (int)uVar35;
      if (*(char *)(lVar9 + iVar21) != '\0') {
        puVar15[UF::length_] = UF::length_;
        uVar16 = UF::length_ + 1;
        *(uint *)(lVar11 + (long)iVar21 * 4) = UF::length_;
        UF::length_ = uVar16;
        if (iVar37 <= iVar21 + 1) break;
        uVar35 = (ulong)(iVar21 + 1);
        while (*(char *)(lVar9 + uVar35) != '\0') {
          *(undefined4 *)(lVar11 + uVar35 * 4) =
               *(undefined4 *)(lVar11 + (long)((int)uVar35 + -1) * 4);
          uVar35 = uVar35 + 1;
          if (iVar37 == (int)uVar35) goto LAB_001a25b9;
        }
      }
      uVar16 = (int)uVar35 + 1;
      uVar35 = (ulong)uVar16;
    } while ((int)uVar16 < iVar37);
  }
LAB_001a25b9:
  if (1 < (int)uVar6) {
    lVar13 = *plVar10;
    lVar14 = *plVar12;
    lVar1 = lVar25 + -1;
    lVar33 = lVar13 + 1 + lVar9;
    lVar20 = lVar11 + lVar14 + 4;
    uVar35 = 1;
    lVar23 = lVar9;
    lVar24 = lVar11;
    local_88 = lVar11;
    do {
      local_88 = local_88 + lVar14;
      lVar3 = lVar9 + lVar13 * uVar35;
      pcVar29 = (char *)(lVar3 - lVar13);
      puVar19 = (uint *)(lVar14 * uVar35 + lVar11);
      puVar22 = (uint *)((long)puVar19 - lVar14);
      cVar5 = *(char *)(lVar9 + lVar13 * uVar35);
      iVar37 = (int)lVar1;
      if (iVar37 == 0) {
        if (cVar5 != '\0') {
          if (*pcVar29 == '\0') {
            puVar15[UF::length_] = UF::length_;
            uVar16 = UF::length_ + 1;
            *puVar19 = UF::length_;
            UF::length_ = uVar16;
          }
          else {
            *puVar19 = *puVar22;
          }
        }
      }
      else {
        lVar18 = lVar1;
        if (cVar5 == '\0') {
          uVar36 = 0;
          goto LAB_001a2706;
        }
        if (*pcVar29 == '\0') {
          if (pcVar29[1] == '\0') {
            puVar15[UF::length_] = UF::length_;
            uVar16 = UF::length_ + 1;
            *puVar19 = UF::length_;
            UF::length_ = uVar16;
            iVar21 = 0;
            goto LAB_001a28f9;
          }
          *puVar19 = puVar22[1];
          uVar36 = 0;
          goto LAB_001a2a19;
        }
        *puVar19 = *puVar22;
        uVar36 = 0;
LAB_001a2a46:
        iVar21 = (int)uVar36;
        if (iVar21 + 1 < iVar37) {
          lVar26 = (long)iVar21;
          lVar32 = lVar26 * 4 + lVar20;
          lVar27 = 0;
          while( true ) {
            if (*(char *)(lVar33 + lVar26 + lVar27) == '\0') {
              uVar16 = (int)(lVar26 + 1) + (int)lVar27;
              goto LAB_001a2b3d;
            }
            if (*(char *)(lVar23 + lVar26 + 1 + lVar27) == '\0') break;
            *(undefined4 *)(lVar32 + lVar27 * 4) =
                 *(undefined4 *)(lVar24 + lVar26 * 4 + 4 + lVar27 * 4);
            lVar27 = lVar27 + 1;
            if ((lVar26 - lVar25) + 2 + lVar27 == 0) {
              iVar21 = iVar21 + (int)lVar27;
              goto LAB_001a2ae5;
            }
          }
          uVar36 = lVar26 + 1 + lVar27;
          iVar21 = iVar21 + (int)lVar27;
          iVar17 = iVar21 + 2;
          if (pcVar29[iVar17] == '\0') {
            *(uint *)(lVar32 + lVar27 * 4) = puVar19[iVar21];
            iVar21 = (int)uVar36;
            goto LAB_001a28f9;
          }
          uVar16 = puVar19[iVar21];
          do {
            uVar28 = uVar16;
            uVar16 = puVar15[uVar28];
            uVar34 = puVar22[iVar17];
          } while (puVar15[uVar28] < uVar28);
          do {
            uVar16 = uVar34;
            uVar34 = puVar15[uVar16];
          } while (puVar15[uVar16] < uVar16);
          if (uVar28 < uVar16) {
            puVar15[uVar16] = uVar28;
            uVar16 = uVar28;
          }
          else {
            puVar15[uVar28] = uVar16;
          }
          *(uint *)(lVar32 + lVar27 * 4) = uVar16;
LAB_001a2a19:
          lVar26 = (long)(int)uVar36;
          uVar36 = lVar26 + 1;
          cVar5 = *(char *)(lVar3 + 1 + lVar26);
          if (iVar37 <= (int)uVar36) {
            if (cVar5 != '\0') {
              puVar19[lVar26 + 1] = puVar22[lVar26 + 1];
            }
            goto LAB_001a2b0e;
          }
          if (cVar5 == '\0') {
LAB_001a2706:
            lVar32 = (long)(int)uVar36;
            lVar26 = 0;
            lVar27 = lVar32 << 0x20;
            do {
              lVar31 = lVar27;
              lVar30 = lVar31 >> 0x20;
              if (lVar1 <= lVar32 + lVar26 + 1) {
                lVar18 = lVar31 + 0x100000000 >> 0x20;
                if (*(char *)(lVar3 + lVar18) == '\0') goto LAB_001a2b0e;
                if (pcVar29[lVar18] == '\0') {
                  if (pcVar29[lVar30] == '\0') {
                    puVar15[UF::length_] = UF::length_;
                    uVar16 = UF::length_ + 1;
                    puVar19[lVar18] = UF::length_;
                    UF::length_ = uVar16;
                    goto LAB_001a2b0e;
                  }
                  uVar16 = puVar22[lVar30];
                }
                else {
                  uVar16 = puVar22[lVar18];
                }
                puVar19[lVar18] = uVar16;
                goto LAB_001a2b0e;
              }
              lVar2 = lVar26 + 1;
              pcVar4 = (char *)(lVar32 + lVar33 + lVar26);
              lVar26 = lVar2;
              lVar27 = lVar31 + 0x100000000;
            } while (*pcVar4 == '\0');
            uVar36 = (uVar36 & 0xffffffff) + lVar2;
            iVar21 = (int)uVar36;
            if (*(char *)(lVar2 + lVar23 + lVar32) != '\0') {
              *(undefined4 *)(local_88 + lVar32 * 4 + lVar2 * 4) =
                   *(undefined4 *)(lVar24 + lVar32 * 4 + lVar2 * 4);
              uVar36 = uVar36 & 0xffffffff;
              goto LAB_001a2a46;
            }
            lVar26 = lVar31 + 0x200000000 >> 0x20;
            if (pcVar29[lVar26] == '\0') {
              if (pcVar29[lVar30] == '\0') {
                puVar15[UF::length_] = UF::length_;
                uVar16 = UF::length_ + 1;
                *(uint *)(local_88 + lVar32 * 4 + lVar2 * 4) = UF::length_;
                UF::length_ = uVar16;
              }
              else {
                *(uint *)(local_88 + lVar32 * 4 + lVar2 * 4) = puVar22[lVar30];
              }
LAB_001a28f9:
              if (iVar37 <= iVar21 + 1) {
                lVar18 = (long)(iVar21 + 1);
LAB_001a2990:
                if (*(char *)(lVar3 + lVar18) == '\0') goto LAB_001a2b0e;
                goto LAB_001a2b05;
              }
              lVar31 = (long)iVar21;
              lVar32 = lVar31 << 0x20;
              lVar27 = lVar31 * 4 + lVar20;
              lVar26 = 0;
              while( true ) {
                if (*(char *)(lVar31 + lVar33 + lVar26) == '\0') goto LAB_001a29a4;
                if (*(char *)(lVar23 + lVar31 + 2 + lVar26) != '\0') break;
                *(undefined4 *)(lVar27 + lVar26 * 4) = *(undefined4 *)(lVar27 + -4 + lVar26 * 4);
                lVar32 = lVar32 + 0x100000000;
                lVar26 = lVar26 + 1;
                if ((lVar25 + -2) - lVar31 == lVar26) {
                  iVar21 = iVar21 + (int)lVar26;
                  goto LAB_001a2990;
                }
              }
              uVar16 = *(uint *)((long)puVar19 + (lVar32 >> 0x1e));
              do {
                uVar34 = uVar16;
                uVar16 = puVar15[uVar34];
              } while (puVar15[uVar34] < uVar34);
              uVar36 = lVar31 + 1 + lVar26;
              uVar16 = *(uint *)(lVar24 + lVar31 * 4 + 8 + lVar26 * 4);
              do {
                uVar28 = uVar16;
                uVar16 = puVar15[uVar28];
              } while (puVar15[uVar28] < uVar28);
              if (uVar34 < uVar28) {
                puVar15[uVar28] = uVar34;
                uVar28 = uVar34;
              }
              else {
                puVar15[uVar34] = uVar28;
              }
              *(uint *)(lVar27 + lVar26 * 4) = uVar28;
            }
            else if (pcVar29[lVar30] == '\0') {
              *(uint *)(local_88 + lVar32 * 4 + lVar2 * 4) = puVar22[lVar26];
            }
            else {
              uVar16 = puVar22[lVar30];
              do {
                uVar28 = uVar16;
                uVar16 = puVar15[uVar28];
                uVar34 = puVar22[lVar26];
              } while (puVar15[uVar28] < uVar28);
              do {
                uVar16 = uVar34;
                uVar34 = puVar15[uVar16];
              } while (puVar15[uVar16] < uVar16);
              if (uVar28 < uVar16) {
                puVar15[uVar16] = uVar28;
                uVar16 = uVar28;
              }
              else {
                puVar15[uVar28] = uVar16;
              }
              *(uint *)(local_88 + lVar32 * 4 + lVar2 * 4) = uVar16;
            }
            goto LAB_001a2a19;
          }
          puVar19[lVar26 + 1] = puVar22[lVar26 + 1];
          goto LAB_001a2a46;
        }
        lVar18 = (long)(iVar21 + 1);
LAB_001a2ae5:
        if (*(char *)(lVar3 + lVar18) != '\0') {
          if (pcVar29[lVar18] == '\0') {
LAB_001a2b05:
            uVar16 = puVar19[iVar21];
          }
          else {
            uVar16 = puVar22[lVar18];
          }
          puVar19[lVar18] = uVar16;
        }
      }
LAB_001a2b0e:
      uVar35 = uVar35 + 1;
      lVar24 = lVar24 + lVar14;
      lVar23 = lVar23 + lVar13;
      lVar33 = lVar33 + lVar13;
      lVar20 = lVar20 + lVar14;
    } while (uVar35 != uVar6);
  }
  return;
LAB_001a29a4:
  uVar16 = (int)(lVar31 + 1) + (int)lVar26;
LAB_001a2b3d:
  uVar36 = (ulong)uVar16;
  goto LAB_001a2706;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"
                
        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
        
#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
    }